

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase827::run(TestCase827 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  Builder local_488;
  bool local_469;
  undefined1 local_468 [7];
  bool _kj_shouldLog_5;
  char (*local_450) [4];
  undefined1 local_448 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_5;
  int local_408;
  bool local_401;
  int64_t iStack_400;
  bool _kj_shouldLog_4;
  int local_3f8;
  DebugExpression<int> local_3f4;
  undefined1 local_3f0 [8];
  DebugComparison<int,_long> _kjCondition_4;
  bool local_3a9;
  undefined1 local_3a8 [7];
  bool _kj_shouldLog_3;
  char (*local_390) [1];
  undefined1 local_388 [8];
  DebugComparison<const_char_(&)[1],_capnp::Text::Builder> _kjCondition_3;
  int local_348;
  bool local_341;
  int64_t iStack_340;
  bool _kj_shouldLog_2;
  int local_338;
  DebugExpression<int> local_334;
  undefined1 local_330 [8];
  DebugComparison<int,_long> _kjCondition_2;
  BuilderFor<capnproto_test::capnp::test::TestNewVersion> newVersion;
  bool local_2c1;
  undefined1 local_2c0 [7];
  bool _kj_shouldLog_1;
  char (*local_2a8) [4];
  undefined1 local_2a0 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_1;
  int64_t local_238;
  int local_230;
  bool local_229;
  undefined1 local_228 [7];
  bool _kj_shouldLog;
  int64_t local_1f8;
  int local_1f0;
  DebugExpression<int> local_1ec;
  undefined1 local_1e8 [8];
  DebugComparison<int,_long> _kjCondition;
  undefined1 local_1a8 [8];
  Orphan<capnproto_test::capnp::test::TestNewVersion> orphan;
  Builder local_178;
  undefined1 local_160 [8];
  BuilderFor<capnproto_test::capnp::test::TestOldVersion> old;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase827 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_178,(Builder *)local_128);
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestOldVersion>
            ((BuilderFor<capnproto_test::capnp::test::TestOldVersion> *)local_160,&local_178);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1((Builder *)local_160,0x4d2);
  Text::Reader::Reader((Reader *)&orphan.builder.location,"foo");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2
            ((Builder *)local_160,(Reader)stack0xfffffffffffffe78);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition.result,(Builder *)local_128);
  AnyPointer::Builder::disownAs<capnproto_test::capnp::test::TestNewVersion>
            ((Orphan<capnproto_test::capnp::test::TestNewVersion> *)local_1a8,
             (Builder *)&_kjCondition.result);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1((Builder *)local_160,0x3039);
  local_1f0 = 0x3039;
  local_1ec = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1f0);
  Orphan<capnproto_test::capnp::test::TestNewVersion>::getReader
            ((ReaderFor<capnproto_test::capnp::test::TestNewVersion> *)local_228,
             (Orphan<capnproto_test::capnp::test::TestNewVersion> *)local_1a8);
  local_1f8 = capnproto_test::capnp::test::TestNewVersion::Reader::getOld1((Reader *)local_228);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_1e8,&local_1ec,&local_1f8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e8);
  if (!bVar1) {
    local_229 = kj::_::Debug::shouldLog(ERROR);
    while (local_229 != false) {
      local_230 = 0x3039;
      Orphan<capnproto_test::capnp::test::TestNewVersion>::getReader
                ((ReaderFor<capnproto_test::capnp::test::TestNewVersion> *)&_kjCondition_1.result,
                 (Orphan<capnproto_test::capnp::test::TestNewVersion> *)local_1a8);
      local_238 = capnproto_test::capnp::test::TestNewVersion::Reader::getOld1
                            ((Reader *)&_kjCondition_1.result);
      kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x347,ERROR,
                 "\"failed: expected \" \"(12345) == (orphan.getReader().getOld1())\", _kjCondition, 12345, orphan.getReader().getOld1()"
                 ,(char (*) [59])"failed: expected (12345) == (orphan.getReader().getOld1())",
                 (DebugComparison<int,_long> *)local_1e8,&local_230,&local_238);
      local_229 = false;
    }
  }
  local_2a8 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld2
            ((Builder *)local_2c0,(Builder *)local_160);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_2a0,
             (DebugExpression<char_const(&)[4]> *)&local_2a8,(Builder *)local_2c0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a0);
  if (!bVar1) {
    local_2c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c1 != false) {
      capnproto_test::capnp::test::TestOldVersion::Builder::getOld2
                ((Builder *)&newVersion._builder.dataSize,(Builder *)local_160);
      kj::_::Debug::
      log<char_const(&)[44],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x348,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (old.getOld2())\", _kjCondition, \"foo\", old.getOld2()"
                 ,(char (*) [44])"failed: expected (\"foo\") == (old.getOld2())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_2a0,
                 (char (*) [4])"foo",(Builder *)&newVersion._builder.dataSize);
      local_2c1 = false;
    }
  }
  Orphan<capnproto_test::capnp::test::TestNewVersion>::get
            ((BuilderFor<capnproto_test::capnp::test::TestNewVersion> *)&_kjCondition_2.result,
             (Orphan<capnproto_test::capnp::test::TestNewVersion> *)local_1a8);
  local_338 = 0;
  local_334 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_338);
  iStack_340 = capnproto_test::capnp::test::TestOldVersion::Builder::getOld1((Builder *)local_160);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_330,&local_334,&stack0xfffffffffffffcc0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_330);
  if (!bVar1) {
    local_341 = kj::_::Debug::shouldLog(ERROR);
    while (local_341 != false) {
      local_348 = 0;
      _kjCondition_3._48_8_ =
           capnproto_test::capnp::test::TestOldVersion::Builder::getOld1((Builder *)local_160);
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x34d,ERROR,
                 "\"failed: expected \" \"(0) == (old.getOld1())\", _kjCondition, 0, old.getOld1()",
                 (char (*) [40])"failed: expected (0) == (old.getOld1())",
                 (DebugComparison<int,_long> *)local_330,&local_348,(long *)&_kjCondition_3.result);
      local_341 = false;
    }
  }
  local_390 = (char (*) [1])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [1])0x4adbe2);
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld2
            ((Builder *)local_3a8,(Builder *)local_160);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)local_388,
             (DebugExpression<char_const(&)[1]> *)&local_390,(Builder *)local_3a8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_388);
  if (!bVar1) {
    local_3a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_3a9 != false) {
      capnproto_test::capnp::test::TestOldVersion::Builder::getOld2
                ((Builder *)&_kjCondition_4.result,(Builder *)local_160);
      kj::_::Debug::
      log<char_const(&)[41],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Builder>&,char_const(&)[1],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x34e,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (old.getOld2())\", _kjCondition, \"\", old.getOld2()"
                 ,(char (*) [41])"failed: expected (\"\") == (old.getOld2())",
                 (DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)local_388,
                 (char (*) [1])0x4adbe2,(Builder *)&_kjCondition_4.result);
      local_3a9 = false;
    }
  }
  local_3f8 = 0x3039;
  local_3f4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3f8);
  iStack_400 = capnproto_test::capnp::test::TestNewVersion::Builder::getOld1
                         ((Builder *)&_kjCondition_2.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_3f0,&local_3f4,&stack0xfffffffffffffc00);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3f0);
  if (!bVar1) {
    local_401 = kj::_::Debug::shouldLog(ERROR);
    while (local_401 != false) {
      local_408 = 0x3039;
      _kjCondition_5._48_8_ =
           capnproto_test::capnp::test::TestNewVersion::Builder::getOld1
                     ((Builder *)&_kjCondition_2.result);
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x350,ERROR,
                 "\"failed: expected \" \"(12345) == (newVersion.getOld1())\", _kjCondition, 12345, newVersion.getOld1()"
                 ,(char (*) [51])"failed: expected (12345) == (newVersion.getOld1())",
                 (DebugComparison<int,_long> *)local_3f0,&local_408,(long *)&_kjCondition_5.result);
      local_401 = false;
    }
  }
  local_450 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
            ((Builder *)local_468,(Builder *)&_kjCondition_2.result);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_448,
             (DebugExpression<char_const(&)[4]> *)&local_450,(Builder *)local_468);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_448);
  if (!bVar1) {
    local_469 = kj::_::Debug::shouldLog(ERROR);
    while (local_469 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
                (&local_488,(Builder *)&_kjCondition_2.result);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x351,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (newVersion.getOld2())\", _kjCondition, \"foo\", newVersion.getOld2()"
                 ,(char (*) [51])"failed: expected (\"foo\") == (newVersion.getOld2())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_448,
                 (char (*) [4])"foo",&local_488);
      local_469 = false;
    }
  }
  Orphan<capnproto_test::capnp::test::TestNewVersion>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestNewVersion> *)local_1a8);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, UpgradeStruct) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  auto old = root.getAnyPointerField().initAs<test::TestOldVersion>();
  old.setOld1(1234);
  old.setOld2("foo");

  auto orphan = root.getAnyPointerField().disownAs<test::TestNewVersion>();

  // Relocation has not occurred yet.
  old.setOld1(12345);
  EXPECT_EQ(12345, orphan.getReader().getOld1());
  EXPECT_EQ("foo", old.getOld2());

  // This will relocate the struct.
  auto newVersion = orphan.get();

  EXPECT_EQ(0, old.getOld1());
  EXPECT_EQ("", old.getOld2());

  EXPECT_EQ(12345, newVersion.getOld1());
  EXPECT_EQ("foo", newVersion.getOld2());
}